

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_mem.c
# Opt level: O3

void init_amqp_pool(amqp_pool_t *pool,size_t pagesize)

{
  size_t sVar1;
  
  sVar1 = 0x1000;
  if (pagesize != 0) {
    sVar1 = pagesize;
  }
  pool->pagesize = sVar1;
  (pool->pages).num_blocks = 0;
  (pool->pages).blocklist = (void **)0x0;
  (pool->large_blocks).num_blocks = 0;
  (pool->large_blocks).blocklist = (void **)0x0;
  pool->next_page = 0;
  pool->alloc_block = (char *)0x0;
  pool->alloc_used = 0;
  return;
}

Assistant:

void init_amqp_pool(amqp_pool_t *pool, size_t pagesize)
{
  pool->pagesize = pagesize ? pagesize : 4096;

  pool->pages.num_blocks = 0;
  pool->pages.blocklist = NULL;

  pool->large_blocks.num_blocks = 0;
  pool->large_blocks.blocklist = NULL;

  pool->next_page = 0;
  pool->alloc_block = NULL;
  pool->alloc_used = 0;
}